

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindDecimalArgMinMax<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  ulong uVar1;
  PhysicalType PVar2;
  PhysicalType PVar3;
  pointer pEVar4;
  size_type sVar5;
  reference this;
  long in_RDX;
  ClientContext *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  type name;
  int64_t cast_cost;
  idx_t i;
  int64_t lowest_cost;
  idx_t best_target;
  vector<duckdb::LogicalType,_true> by_types;
  LogicalType by_type;
  LogicalType decimal_type;
  AggregateFunction *in_stack_fffffffffffffdb8;
  AggregateFunction *in_stack_fffffffffffffdc0;
  LogicalType *in_stack_fffffffffffffdc8;
  reference in_stack_fffffffffffffdd0;
  LogicalType *in_stack_fffffffffffffdd8;
  string local_b8 [32];
  LogicalType *local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  LogicalType local_50 [24];
  LogicalType local_38 [32];
  long local_18;
  ClientContext *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffdc0);
  duckdb::LogicalType::LogicalType(local_38,(LogicalType *)(pEVar4 + 0x38));
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffdc0);
  duckdb::LogicalType::LogicalType(local_50,(LogicalType *)(pEVar4 + 0x38));
  ArgMaxByTypes();
  local_80 = 0xffffffffffffffff;
  local_88 = NumericLimits<long>::Maximum();
  local_90 = 0;
  do {
    uVar1 = local_90;
    sVar5 = std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(&local_78);
    if (sVar5 <= uVar1) {
LAB_00855740:
      if (local_80 != 0xffffffffffffffff) {
        in_stack_fffffffffffffdc0 =
             (AggregateFunction *)
             vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffdc0,
                        (size_type)in_stack_fffffffffffffdb8);
        LogicalType::operator=(in_stack_fffffffffffffdc8,(LogicalType *)in_stack_fffffffffffffdc0);
      }
      std::__cxx11::string::string(local_b8,(string *)(local_18 + 8));
      GetDecimalArgMinMaxFunction<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      AggregateFunction::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      AggregateFunction::~AggregateFunction(in_stack_fffffffffffffdc0);
      std::__cxx11::string::operator=((string *)(local_18 + 8),local_b8);
      LogicalType::operator=(in_stack_fffffffffffffdc8,(LogicalType *)in_stack_fffffffffffffdc0);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<std::default_delete<duckdb::FunctionData>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_b8);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x855829);
      duckdb::LogicalType::~LogicalType(local_50);
      duckdb::LogicalType::~LogicalType(local_38);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    this = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffdc0,
                      (size_type)in_stack_fffffffffffffdb8);
    PVar2 = LogicalType::InternalType(this);
    PVar3 = LogicalType::InternalType(local_50);
    if (PVar2 == PVar3) {
      local_88 = 0;
      local_80 = 0xffffffffffffffff;
      goto LAB_00855740;
    }
    in_stack_fffffffffffffdd8 = (LogicalType *)duckdb::CastFunctionSet::Get(local_10);
    in_stack_fffffffffffffdd0 =
         vector<duckdb::LogicalType,_true>::operator[]
                   ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffdc0,
                    (size_type)in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffdc8 =
         (LogicalType *)
         duckdb::CastFunctionSet::ImplicitCastCost(in_stack_fffffffffffffdd8,local_50);
    if ((-1 < (long)in_stack_fffffffffffffdc8) && ((long)in_stack_fffffffffffffdc8 < local_88)) {
      local_80 = local_90;
    }
    local_90 = local_90 + 1;
    local_98 = in_stack_fffffffffffffdc8;
  } while( true );
}

Assistant:

static unique_ptr<FunctionData> BindDecimalArgMinMax(ClientContext &context, AggregateFunction &function,
                                                     vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	auto by_type = arguments[1]->return_type;

	// To avoid a combinatorial explosion, cast the ordering argument to one from the list
	auto by_types = ArgMaxByTypes();
	idx_t best_target = DConstants::INVALID_INDEX;
	int64_t lowest_cost = NumericLimits<int64_t>::Maximum();
	for (idx_t i = 0; i < by_types.size(); ++i) {
		// Before falling back to casting, check for a physical type match for the by_type
		if (by_types[i].InternalType() == by_type.InternalType()) {
			lowest_cost = 0;
			best_target = DConstants::INVALID_INDEX;
			break;
		}

		auto cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(by_type, by_types[i]);
		if (cast_cost < 0) {
			continue;
		}
		if (cast_cost < lowest_cost) {
			best_target = i;
		}
	}

	if (best_target != DConstants::INVALID_INDEX) {
		by_type = by_types[best_target];
	}

	auto name = std::move(function.name);
	function = GetDecimalArgMinMaxFunction<OP>(by_type, decimal_type);
	function.name = std::move(name);
	function.return_type = decimal_type;
	return nullptr;
}